

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

void rfc5444_writer_init(rfc5444_writer *writer)

{
  list_entity *plVar1;
  uint8_t *puVar2;
  size_t mtu;
  uint __line;
  char *__assertion;
  
  puVar2 = writer->msg_buffer;
  if ((puVar2 == (uint8_t *)0x0) || (mtu = writer->msg_size, mtu == 0)) {
    __assertion = "writer->msg_buffer != NULL && writer->msg_size > 0";
    __line = 0x54;
  }
  else {
    if ((writer->addrtlv_buffer != (uint8_t *)0x0) && (writer->addrtlv_size != 0)) {
      if (writer->malloc_address_entry == (_func_rfc5444_writer_address_ptr *)0x0) {
        writer->malloc_address_entry = _malloc_address_entry;
      }
      if (writer->malloc_addrtlv_entry == (_func_rfc5444_writer_addrtlv_ptr *)0x0) {
        writer->malloc_addrtlv_entry = _malloc_addrtlv_entry;
      }
      if (writer->free_address_entry == (_func_void_rfc5444_writer_address_ptr *)0x0) {
        writer->free_address_entry = _free_address_entry;
      }
      if (writer->free_addrtlv_entry == (_func_void_rfc5444_writer_addrtlv_ptr *)0x0) {
        writer->free_addrtlv_entry = _free_addrtlv_entry;
      }
      plVar1 = &writer->_targets;
      (writer->_targets).prev = plVar1;
      (writer->_targets).next = plVar1;
      (writer->_msg).buffer = puVar2;
      _rfc5444_tlv_writer_init(&writer->_msg,0,mtu);
      (writer->_pkthandlers).prev = &writer->_pkthandlers;
      (writer->_pkthandlers).next = &writer->_pkthandlers;
      (writer->_targets).prev = plVar1;
      (writer->_targets).next = plVar1;
      (writer->_addr_tlvtype_head).prev = &writer->_addr_tlvtype_head;
      (writer->_addr_tlvtype_head).next = &writer->_addr_tlvtype_head;
      avl_init(&writer->_msgcreators,&avl_comp_uint8,0);
      avl_init(&writer->_processors,&avl_comp_int32,1);
      avl_init(&writer->_forwarding_processors,&avl_comp_int32,1);
      writer->_state = RFC5444_WRITER_NONE;
      return;
    }
    __assertion = "writer->addrtlv_buffer != NULL && writer->addrtlv_size > 0";
    __line = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,__line,"void rfc5444_writer_init(struct rfc5444_writer *)");
}

Assistant:

void
rfc5444_writer_init(struct rfc5444_writer *writer) {
  assert(writer->msg_buffer != NULL && writer->msg_size > 0);
  assert(writer->addrtlv_buffer != NULL && writer->addrtlv_size > 0);

  /* set default memory handler functions */
  if (!writer->malloc_address_entry)
    writer->malloc_address_entry = _malloc_address_entry;
  if (!writer->malloc_addrtlv_entry)
    writer->malloc_addrtlv_entry = _malloc_addrtlv_entry;
  if (!writer->free_address_entry)
    writer->free_address_entry = _free_address_entry;
  if (!writer->free_addrtlv_entry)
    writer->free_addrtlv_entry = _free_addrtlv_entry;

  list_init_head(&writer->_targets);

  /* initialize packet buffer */
  writer->_msg.buffer = writer->msg_buffer;
  _rfc5444_tlv_writer_init(&writer->_msg, 0, writer->msg_size);

  list_init_head(&writer->_pkthandlers);
  list_init_head(&writer->_targets);
  list_init_head(&writer->_addr_tlvtype_head);

  avl_init(&writer->_msgcreators, avl_comp_uint8, false);
  avl_init(&writer->_processors, avl_comp_int32, true);
  avl_init(&writer->_forwarding_processors, avl_comp_int32, true);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif
}